

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceGroupsLexerHelper.cxx
# Opt level: O2

void __thiscall
cmCTestResourceGroupsLexerHelper::WriteProcess(cmCTestResourceGroupsLexerHelper *this)

{
  uint i;
  uint uVar1;
  
  for (uVar1 = 0; uVar1 < this->ProcessCount; uVar1 = uVar1 + 1) {
    std::
    vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
    ::push_back(this->Output,&this->Process);
  }
  std::
  vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
  ::clear(&this->Process);
  this->ProcessCount = 1;
  return;
}

Assistant:

void cmCTestResourceGroupsLexerHelper::WriteProcess()
{
  for (unsigned int i = 0; i < this->ProcessCount; ++i) {
    this->Output.push_back(this->Process);
  }
  this->Process.clear();
  this->ProcessCount = 1;
}